

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

tuple<unsigned_long,_unsigned_long,_int> * __thiscall
greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
::get_coboundary_size_and_gap_and_pivot
          (greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
           *this,filtration_entry_t a)

{
  bool bVar1;
  index_t iVar2;
  filtration_entry_t fVar3;
  tuple<unsigned_long,_unsigned_long,_int> *in_RDI;
  index_t next_index;
  size_t coboundary_size;
  coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  iterator;
  size_t gap_after_pivot;
  index_t pivot;
  int *in_stack_ffffffffffffff78;
  tuple<unsigned_long,_unsigned_long,_int> *__args;
  entry_t eStack_68;
  directed_flag_complex_in_memory_computer_t *in_stack_ffffffffffffffc8;
  filtration_entry_t in_stack_ffffffffffffffd0;
  coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  index_t iVar4;
  
  iVar4 = 0;
  this_00 = (coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
             *)0x0;
  __args = in_RDI;
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::coboundary
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  while (bVar1 = directed_flag_complex_in_memory_computer::
                 coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                 ::has_next((coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                             *)CONCAT44(iVar4,in_stack_ffffffffffffffe0)), bVar1) {
    fVar3 = directed_flag_complex_in_memory_computer::
            coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ::next(this_00);
    eStack_68 = fVar3.super_pair<float,_int>.second;
    iVar2 = get_index(eStack_68);
    if (iVar4 < iVar2) {
      this_00 = (coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                 *)(long)(iVar2 - iVar4);
      iVar4 = iVar2;
    }
  }
  std::make_tuple<unsigned_long&,unsigned_long&,int&>
            ((unsigned_long *)__args,(unsigned_long *)in_RDI,in_stack_ffffffffffffff78);
  return __args;
}

Assistant:

std::tuple<size_t, size_t, index_t> get_coboundary_size_and_gap_and_pivot(filtration_entry_t a) const {
		// Look at the first two gaps of the pivot and the next element
		index_t pivot = 0;
		size_t gap_after_pivot = 0;
		auto iterator = complex.coboundary(a);
		size_t coboundary_size = 0;
		while (iterator.has_next()) {
			coboundary_size++;
			index_t next_index = get_index(iterator.next().second);
			if (next_index > pivot) {
				gap_after_pivot = next_index - pivot;
				pivot = next_index;
			}
		}

		return std::make_tuple(coboundary_size, gap_after_pivot, pivot);
	}